

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O0

void __thiscall IRTreeBuildVisitor::Visit(IRTreeBuildVisitor *this,PrintStatement *statement)

{
  int iVar1;
  ExpressionList *this_00;
  SubtreeWrapper *pSVar2;
  undefined4 extraout_var;
  ExpressionWrapper *this_01;
  CallExpression *this_02;
  NameExpression *this_03;
  allocator<char> local_71;
  string local_70;
  Label local_50;
  ExpressionList *local_20;
  ExpressionList *irt_expressions;
  PrintStatement *statement_local;
  IRTreeBuildVisitor *this_local;
  
  irt_expressions = (ExpressionList *)statement;
  statement_local = (PrintStatement *)this;
  this_00 = (ExpressionList *)operator_new(0x20);
  (this_00->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->super_BaseElement)._vptr_BaseElement = (_func_int **)0x0;
  (this_00->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  IRT::ExpressionList::ExpressionList(this_00);
  local_20 = this_00;
  pSVar2 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                     (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                      (Node *)(irt_expressions->expressions_).
                              super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
  iVar1 = (*pSVar2->_vptr_SubtreeWrapper[2])();
  IRT::ExpressionList::Add(this_00,(Expression *)CONCAT44(extraout_var,iVar1));
  this_01 = (ExpressionWrapper *)operator_new(0x10);
  this_02 = (CallExpression *)operator_new(0x18);
  this_03 = (NameExpression *)operator_new(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"print",&local_71);
  IRT::Label::Label(&local_50,&local_70);
  IRT::NameExpression::NameExpression(this_03,&local_50);
  IRT::CallExpression::CallExpression(this_02,(Expression *)this_03,local_20);
  IRT::ExpressionWrapper::ExpressionWrapper(this_01,(Expression *)this_02);
  (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)this_01;
  IRT::Label::~Label(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  return;
}

Assistant:

void IRTreeBuildVisitor::Visit(PrintStatement* statement) {
  auto* irt_expressions = new IRT::ExpressionList();
  irt_expressions->Add(Accept(statement->expression_)->ToExpression());

  tos_value_ = new IRT::ExpressionWrapper(new IRT::CallExpression(
      new IRT::NameExpression(IRT::Label("print")), irt_expressions));
}